

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImRect ImGui::ShowMetricsWindow::Funcs::GetWindowRect(ImGuiWindow_conflict *window,int rect_type)

{
  ImVec2 IVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ImRect IVar5;
  ImRect IVar6;
  
  switch(rect_type) {
  case 0:
    IVar5.Max.x = (window->Pos).x + (window->Size).x;
    IVar5.Max.y = (window->Pos).y + (window->Size).y;
    IVar5.Min = window->Pos;
    return IVar5;
  case 1:
    return window->OuterRectClipped;
  case 2:
    return window->InnerRect;
  case 3:
    return window->InnerClipRect;
  case 4:
    return window->WorkRect;
  case 5:
    fVar2 = ((window->InnerRect).Min.x - (window->Scroll).x) + (window->WindowPadding).x;
    fVar4 = ((window->InnerRect).Min.y - (window->Scroll).y) + (window->WindowPadding).y;
    fVar3 = fVar2 + (window->ContentSize).x;
    IVar1.y = fVar4;
    IVar1.x = fVar2;
    fVar4 = fVar4 + (window->ContentSize).y;
    break;
  case 6:
    fVar2 = ((window->InnerRect).Min.x - (window->Scroll).x) + (window->WindowPadding).x;
    fVar4 = ((window->InnerRect).Min.y - (window->Scroll).y) + (window->WindowPadding).y;
    fVar3 = fVar2 + (window->ContentSizeIdeal).x;
    IVar1.y = fVar4;
    IVar1.x = fVar2;
    fVar4 = fVar4 + (window->ContentSizeIdeal).y;
    break;
  case 7:
    return window->ContentRegionRect;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x4135,
                  "static ImRect ImGui::ShowMetricsWindow(bool *)::Funcs::GetWindowRect(ImGuiWindow *, int)"
                 );
  }
  IVar6.Max.y = fVar4;
  IVar6.Max.x = fVar3;
  IVar6.Min = IVar1;
  return IVar6;
}

Assistant:

static ImRect GetWindowRect(ImGuiWindow* window, int rect_type)
        {
            if (rect_type == WRT_OuterRect)                 { return window->Rect(); }
            else if (rect_type == WRT_OuterRectClipped)     { return window->OuterRectClipped; }
            else if (rect_type == WRT_InnerRect)            { return window->InnerRect; }
            else if (rect_type == WRT_InnerClipRect)        { return window->InnerClipRect; }
            else if (rect_type == WRT_WorkRect)             { return window->WorkRect; }
            else if (rect_type == WRT_Content)       { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSize); }
            else if (rect_type == WRT_ContentIdeal)         { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSizeIdeal); }
            else if (rect_type == WRT_ContentRegionRect)    { return window->ContentRegionRect; }
            IM_ASSERT(0);
            return ImRect();
        }